

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

string_stream * __thiscall
argh::parser::operator()(string_stream *__return_storage_ptr__,parser *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_60 [3];
  undefined1 local_48 [32];
  _Self local_28;
  const_iterator optIt;
  string *name_local;
  parser *this_local;
  
  optIt._M_node = (_Base_ptr)name;
  trim_leading_dashes((parser *)local_48,(string *)this);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->params_,(key_type *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->params_);
  bVar1 = std::operator!=(local_60,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    bad_stream(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

inline string_stream parser::operator()(std::string const &name) const {
        auto optIt = params_.find(trim_leading_dashes(name));
        if (params_.end() != optIt)
            return string_stream(optIt->second);
        return bad_stream();
    }